

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool __thiscall
QSslSocket::setSocketDescriptor
          (QSslSocket *this,qintptr socketDescriptor,SocketState state,OpenMode openMode)

{
  long lVar1;
  byte bVar2;
  SocketError SVar3;
  undefined4 uVar4;
  QSslSocketPrivate *pQVar5;
  qintptr qVar6;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  QFlags_conflict *in_RDI;
  long in_FS_OFFSET;
  bool retVal;
  QSslSocketPrivate *d;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> in_stack_0000006c;
  QSslSocketPrivate *name;
  undefined4 in_stack_ffffffffffffff40;
  QAbstractSocket *this_00;
  QAbstractSocket *this_01;
  QAbstractSocket local_48;
  QAbstractSocket local_30;
  QSslSocketPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QSslSocket *)0x3a0cf0);
  if (pQVar5->plainSocket == (QTcpSocket *)0x0) {
    QSslSocketPrivate::createPlainSocket(in_stack_ffffffffffffffe0,(OpenMode)in_stack_0000006c.i);
  }
  bVar2 = (**(code **)(*(long *)&pQVar5->plainSocket->super_QAbstractSocket + 0x118))
                    (pQVar5->plainSocket,in_RSI,in_EDX,in_ECX);
  qVar6 = (**(code **)(*(long *)&pQVar5->plainSocket->super_QAbstractSocket + 0x110))();
  (pQVar5->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = qVar6;
  name = pQVar5;
  SVar3 = QAbstractSocket::error((QAbstractSocket *)0x3a0d99);
  this_00 = &local_30;
  QIODevice::errorString();
  QAbstractSocketPrivate::setError
            ((QAbstractSocketPrivate *)CONCAT44(SVar3,in_stack_ffffffffffffff40),
             (SocketError)((ulong)name >> 0x20),(QString *)0x3a0dcd);
  QString::~QString((QString *)0x3a0dd7);
  QAbstractSocket::setSocketState
            ((QAbstractSocket *)CONCAT44(SVar3,in_stack_ffffffffffffff40),
             (SocketState)((ulong)name >> 0x20));
  QIODevice::setOpenMode(in_RDI);
  QAbstractSocket::localPort((QAbstractSocket *)CONCAT44(SVar3,in_stack_ffffffffffffff40));
  QAbstractSocket::setLocalPort
            ((QAbstractSocket *)CONCAT44(SVar3,in_stack_ffffffffffffff40),
             (quint16)((ulong)name >> 0x30));
  QAbstractSocket::localAddress(this_00);
  QAbstractSocket::setLocalAddress
            ((QAbstractSocket *)CONCAT44(SVar3,in_stack_ffffffffffffff40),(QHostAddress *)name);
  QHostAddress::~QHostAddress((QHostAddress *)0x3a0e59);
  QAbstractSocket::peerPort((QAbstractSocket *)CONCAT44(SVar3,in_stack_ffffffffffffff40));
  QAbstractSocket::setPeerPort
            ((QAbstractSocket *)CONCAT44(SVar3,in_stack_ffffffffffffff40),
             (quint16)((ulong)name >> 0x30));
  this_01 = &local_48;
  QAbstractSocket::peerAddress(this_00);
  QAbstractSocket::setPeerAddress
            ((QAbstractSocket *)CONCAT44(SVar3,in_stack_ffffffffffffff40),(QHostAddress *)name);
  QHostAddress::~QHostAddress((QHostAddress *)0x3a0eae);
  QAbstractSocket::peerName(this_01);
  QAbstractSocket::setPeerName
            ((QAbstractSocket *)CONCAT44(SVar3,in_stack_ffffffffffffff40),(QString *)name);
  QString::~QString((QString *)0x3a0ee2);
  uVar4 = QIODevice::readChannelCount();
  *(undefined4 *)&(pQVar5->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xa8 = uVar4;
  uVar4 = QIODevice::writeChannelCount();
  *(undefined4 *)&(pQVar5->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xac = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::setSocketDescriptor(qintptr socketDescriptor, SocketState state, OpenMode openMode)
{
    Q_D(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::setSocketDescriptor(" << socketDescriptor << ','
             << state << ',' << openMode << ')';
#endif
    if (!d->plainSocket)
        d->createPlainSocket(openMode);
    bool retVal = d->plainSocket->setSocketDescriptor(socketDescriptor, state, openMode);
    d->cachedSocketDescriptor = d->plainSocket->socketDescriptor();
    d->setError(d->plainSocket->error(), d->plainSocket->errorString());
    setSocketState(state);
    setOpenMode(openMode);
    setLocalPort(d->plainSocket->localPort());
    setLocalAddress(d->plainSocket->localAddress());
    setPeerPort(d->plainSocket->peerPort());
    setPeerAddress(d->plainSocket->peerAddress());
    setPeerName(d->plainSocket->peerName());
    d->readChannelCount = d->plainSocket->readChannelCount();
    d->writeChannelCount = d->plainSocket->writeChannelCount();
    return retVal;
}